

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O3

bool __thiscall
cmQtAutoGenerators::FileDiffers(cmQtAutoGenerators *this,string *filename,string *content)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  string oldContents;
  string local_38;
  
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  bVar1 = ReadAll(&local_38,(string *)(filename->_M_dataplus)._M_p);
  bVar3 = true;
  if ((bVar1) && (local_38._M_string_length == content->_M_string_length)) {
    if (local_38._M_string_length == 0) {
      bVar3 = false;
    }
    else {
      iVar2 = bcmp(local_38._M_dataplus._M_p,(content->_M_dataplus)._M_p,local_38._M_string_length);
      bVar3 = iVar2 != 0;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,
                    CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                             local_38.field_2._M_local_buf[0]) + 1);
  }
  return bVar3;
}

Assistant:

bool cmQtAutoGenerators::FileDiffers(const std::string& filename,
                                     const std::string& content)
{
  bool differs = true;
  {
    std::string oldContents;
    if (ReadAll(oldContents, filename)) {
      differs = (oldContents != content);
    }
  }
  return differs;
}